

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O0

int __thiscall Layer_c_api::load_model(Layer_c_api *this,ModelBin *mb)

{
  int iVar1;
  long in_RDI;
  __ncnn_modelbin_t mb0;
  undefined1 local_30 [8];
  code *local_28;
  code *local_20;
  code *local_18;
  
  local_28 = __ncnn_modelbin_load_1d;
  local_20 = __ncnn_modelbin_load_2d;
  local_18 = __ncnn_modelbin_load_3d;
  iVar1 = (**(code **)(*(long *)(in_RDI + 0xd0) + 0x10))(*(undefined8 *)(in_RDI + 0xd0),local_30);
  return iVar1;
}

Assistant:

virtual int load_model(const ModelBin& mb)
    {
        struct __ncnn_modelbin_t mb0;
        mb0.pthis = (void*)&mb;
        mb0.load_1d = __ncnn_modelbin_load_1d;
        mb0.load_2d = __ncnn_modelbin_load_2d;
        mb0.load_3d = __ncnn_modelbin_load_3d;
        return layer->load_model(layer, &mb0);
    }